

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O3

void addstr(lua_State *L,SBuf *sb,char *str,MSize len)

{
  uint osz;
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  uint nsz;
  uint uVar4;
  
  uVar2 = sb->n;
  osz = sb->sz;
  uVar4 = uVar2 + len;
  nsz = osz;
  if (osz < uVar4) {
    do {
      nsz = nsz * 2;
    } while (nsz < uVar4);
    pcVar1 = (char *)lj_mem_realloc(L,sb->buf,osz,nsz);
    sb->buf = pcVar1;
    sb->sz = nsz;
    uVar2 = sb->n;
    uVar4 = uVar2 + len;
  }
  else {
    pcVar1 = sb->buf;
  }
  sb->n = uVar4;
  if (len != 0) {
    uVar3 = 0;
    do {
      pcVar1[uVar3 + uVar2] = str[uVar3];
      uVar3 = uVar3 + 1;
    } while (len != uVar3);
  }
  return;
}

Assistant:

static void addstr(lua_State *L, SBuf *sb, const char *str, MSize len)
{
  char *p;
  MSize i;
  if (sb->n + len > sb->sz) {
    MSize sz = sb->sz * 2;
    while (sb->n + len > sz) sz = sz * 2;
    lj_str_resizebuf(L, sb, sz);
  }
  p = sb->buf + sb->n;
  sb->n += len;
  for (i = 0; i < len; i++) p[i] = str[i];
}